

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.cpp
# Opt level: O2

bool __thiscall node::isIn(node *this,double x,double a,double b)

{
  double dVar1;
  
  dVar1 = a;
  if (a <= b) {
    dVar1 = b;
    b = a;
  }
  return (bool)(-(x <= dVar1) & -(b <= x) & 1);
}

Assistant:

bool node::isIn(double x, double a, double b){
    if(a > b){
        double tmp = a;
        a = b;
        b = tmp;
    }
    if(a <= x && x <= b){
        return true;
    }return false;
}